

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O3

void lace_start(uint _n_workers,size_t dqsize)

{
  ushort uVar1;
  WorkerP *self;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  Worker **ppWVar5;
  WorkerP **ppWVar6;
  Task *__dq_head;
  void *__arg;
  ulong uVar7;
  rlim_t __stacksize;
  uint uVar8;
  Worker **ppWVar9;
  Worker **ppWVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  rlimit lim;
  pthread_attr_t worker_attr;
  rlimit local_78;
  pthread_attr_t local_68;
  
  uVar4 = sysconf(0x54);
  if (_n_workers == 0) {
    _n_workers = (uint)uVar4;
  }
  if (dqsize != 0) {
    default_dqsize = dqsize;
  }
  sVar2 = default_dqsize;
  LOCK();
  lace_quits = 0;
  UNLOCK();
  workers_running = 0;
  lace_bar.wait = 0;
  lace_bar._132_4_ = 0;
  lace_bar._136_8_ = 0;
  lace_bar._144_8_ = 0;
  lace_bar._152_8_ = 0;
  lace_bar._160_8_ = 0;
  lace_bar._168_8_ = 0;
  lace_bar._176_8_ = 0;
  lace_bar._184_8_ = 0;
  lace_bar.leaving = 0;
  lace_bar._68_4_ = 0;
  lace_bar._72_8_ = 0;
  lace_bar._80_8_ = 0;
  lace_bar._88_8_ = 0;
  lace_bar._96_8_ = 0;
  lace_bar._104_8_ = 0;
  lace_bar._112_8_ = 0;
  lace_bar._120_8_ = 0;
  lace_bar.count = 0;
  lace_bar._4_4_ = 0;
  lace_bar._8_8_ = 0;
  lace_bar._16_8_ = 0;
  lace_bar._24_8_ = 0;
  lace_bar._32_8_ = 0;
  lace_bar._40_8_ = 0;
  lace_bar._48_8_ = 0;
  lace_bar._56_8_ = 0;
  suspend_semaphore = (sem_t)(ZEXT432(0) << 0x40);
  n_workers = _n_workers;
  sem_init((sem_t *)&suspend_semaphore,0,0);
  LOCK();
  must_suspend = 0;
  UNLOCK();
  LOCK();
  lace_awaken_count = 0;
  UNLOCK();
  uVar14 = (ulong)n_workers;
  uVar7 = uVar14 * 8 + 0x3f & 0xffffffffffffffc0;
  ppWVar5 = (Worker **)aligned_alloc(0x40,uVar7);
  workers = ppWVar5;
  ppWVar6 = (WorkerP **)aligned_alloc(0x40,uVar7);
  uVar8 = 0x40;
  workers_p = ppWVar6;
  workers_memory = (worker_data **)aligned_alloc();
  if (((ppWVar5 != (Worker **)0x0) && (ppWVar6 != (WorkerP **)0x0)) &&
     (workers_memory != (worker_data **)0x0)) {
    memset(ppWVar5,0,uVar14 << 3);
    workers_memory_size = sVar2 * 0x40 + 0xc0;
    pthread_attr_init(&local_68);
    __stacksize = stacksize;
    if (stacksize == 0) {
      getrlimit(RLIMIT_STACK,&local_78);
      __stacksize = 0x1000000;
      if (local_78.rlim_cur < 0x1000000) {
        __stacksize = local_78.rlim_cur;
      }
    }
    pthread_attr_setstacksize(&local_68,__stacksize);
    if (verbosity == 0) {
      lace_newframe.t = (Task *)0x0;
    }
    else {
      fprintf(_stdout,"Initializing Lace, %u available cores, %d workers.\n",uVar4 & 0xffffffff,
              (ulong)n_workers);
      lace_newframe.t = (Task *)0x0;
      if (verbosity != 0) {
        fprintf(_stdout,"Lace startup, creating %d worker threads with program stack %zu bytes.\n",
                (ulong)n_workers,stacksize);
      }
    }
    if (n_workers != 0) {
      __arg = (void *)0x0;
      do {
        pthread_create(&local_78.rlim_cur,&local_68,lace_worker_thread,__arg);
        __arg = (void *)((long)__arg + 1);
      } while (__arg < (void *)(ulong)n_workers);
    }
    lace_resume();
    pthread_attr_destroy(&local_68);
    return;
  }
  lace_start_cold_1();
  lace_init_worker(uVar8);
  sem_wait((sem_t *)&suspend_semaphore);
  LOCK();
  workers_running = workers_running + 1;
  UNLOCK();
  self = *(WorkerP **)(in_FS_OFFSET + -8);
  __dq_head = lace_get_head(self);
  uVar8 = n_workers;
  uVar1 = self->worker;
  uVar13 = (uint)uVar1;
  uVar4 = (ulong)n_workers;
  ppWVar5 = (Worker **)((ulong)((uint)uVar1 * 8) + (long)workers);
  if (lace_quits == 0) {
    uVar3 = n_workers - 1;
    uVar11 = 0;
    ppWVar10 = ppWVar5;
    do {
      if (1 < uVar8) {
        if ((int)uVar11 < 1) {
          iVar12 = uVar13 * 0x41c64e6d;
          uVar13 = uVar13 * -0x3d5d6597 + 0xd3dc167e;
          uVar11 = (iVar12 + 0x3039U) % 0x28;
          ppWVar10 = workers + (ulong)(uVar1 + 1 + uVar13 % uVar3) % (ulong)uVar8;
        }
        else {
          uVar11 = uVar11 - 1;
          ppWVar9 = ppWVar10 + 2;
          if (ppWVar10 + 1 != ppWVar5) {
            ppWVar9 = ppWVar10 + 1;
          }
          if (workers + uVar4 <= ppWVar9) {
            ppWVar9 = workers;
          }
          ppWVar10 = ppWVar9 + (ppWVar9 == ppWVar5);
        }
        lace_steal(self,__dq_head,*ppWVar10);
      }
      if (lace_newframe.t != (Task *)0x0) {
        lace_yield(self,__dq_head);
      }
      if (external_task != (ExtTask *)0x0) {
        lace_steal_external(self,__dq_head);
      }
      if (must_suspend != 0) {
        lace_worker_thread_cold_1();
      }
    } while (lace_quits == 0);
  }
  LOCK();
  workers_running = workers_running - 1;
  UNLOCK();
  return;
}

Assistant:

void
lace_start(unsigned int _n_workers, size_t dqsize)
{
#if LACE_USE_HWLOC
    // Initialize topology and information about cpus
    hwloc_topology_init(&topo);
    hwloc_topology_load(topo);

    n_nodes = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_NODE);
    n_cores = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_CORE);
    n_pus = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_PU);
#else
    unsigned int n_pus = lace_get_pu_count();
#endif

    // Initialize globals
    n_workers = _n_workers == 0 ? n_pus : _n_workers;
    if (dqsize != 0) default_dqsize = dqsize;
    else dqsize = default_dqsize;
    lace_quits = 0;
    atomic_store_explicit(&workers_running, 0, memory_order_relaxed);

    // Initialize Lace barrier
    lace_barrier_init();

    // Create suspend semaphore
    memset(&suspend_semaphore, 0, sizeof(sem_t));
    sem_init(&suspend_semaphore, 0, 0);

    must_suspend = 0;
    lace_awaken_count = 0;

    // Allocate array with all workers
    // first make sure that the amount to allocate (n_workers times pointer) is a multiple of LINE_SIZE
    size_t to_allocate = n_workers * sizeof(void*);
    to_allocate = (to_allocate+LINE_SIZE-1) & (~(LINE_SIZE-1));
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    workers = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = _aligned_malloc(to_allocate, LINE_SIZE);
#elif defined(__MINGW32__)
    workers = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
#else
    workers = aligned_alloc(LINE_SIZE, to_allocate);
    workers_p = aligned_alloc(LINE_SIZE, to_allocate);
    workers_memory = aligned_alloc(LINE_SIZE, to_allocate);
#endif
    if (workers == 0 || workers_p == 0 || workers_memory == 0) {
        fprintf(stderr, "Lace error: unable to allocate memory for the workers!\n");
        exit(1);
    }

    // Ensure worker array is set to 0 initially
    memset(workers, 0, n_workers*sizeof(Worker*));

    // Compute memory size for each worker
    workers_memory_size = sizeof(worker_data) + sizeof(Task) * dqsize;

#ifndef __linux__
    // Create pthread key
    pthread_key_create(&current_worker_key, NULL);
#endif

    // Prepare structures for thread creation
    pthread_attr_t worker_attr;
    pthread_attr_init(&worker_attr);

    // Set the stack size
    if (stacksize != 0) {
        pthread_attr_setstacksize(&worker_attr, stacksize);
    } else {
	// on certain systems, the default stack size is too small (e.g. OSX)
	// so by default, we just pick the current RLIMIT_STACK or 16M whichever is smallest
#ifndef _WIN32
	struct rlimit lim;
	getrlimit(RLIMIT_STACK, &lim);
	size_t size = lim.rlim_cur;
	if (size > 16*1024*1024) size = 16*1024*1024;
#else
	size_t size = 16*1024*1024;
#endif
        pthread_attr_setstacksize(&worker_attr, size);
    }

    if (verbosity) {
#if LACE_USE_HWLOC
        fprintf(stdout, "Initializing Lace, %u nodes, %u cores, %u logical processors, %d workers.\n", n_nodes, n_cores, n_pus, n_workers);
#else
        fprintf(stdout, "Initializing Lace, %u available cores, %d workers.\n", n_pus, n_workers);
#endif
    }

    // Prepare lace_init structure
    atomic_store_explicit(&lace_newframe.t, NULL, memory_order_relaxed);

#if LACE_PIE_TIMES
    // Initialize counters for pie times
    us_elapsed_start();
    count_at_start = gethrtime();
#endif

    /* Report startup if verbose */
    if (verbosity) {
        fprintf(stdout, "Lace startup, creating %d worker threads with program stack %zu bytes.\n", n_workers, stacksize);
    }

    /* Spawn all workers */
    for (unsigned int i=0; i<n_workers; i++) {
        pthread_t res;
        pthread_create(&res, &worker_attr, lace_worker_thread, (void*)(size_t)i);
    }

    /* Make sure we start resumed */
    lace_resume();

    pthread_attr_destroy(&worker_attr);
}